

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-varr.h
# Opt level: O3

void mir_varr_error(char *message)

{
  fprintf(_stderr,"%s\n","varr: no memory");
  exit(1);
}

Assistant:

static inline void MIR_VARR_NO_RETURN mir_varr_error (const char *message) {
#ifdef MIR_VARR_ERROR
  MIR_VARR_ERROR (message);
  assert (0);
#else
  fprintf (stderr, "%s\n", message);
#endif
  exit (1);
}